

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void destStore64Gray8(QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *buffer,int length)

{
  uchar *puVar1;
  quint64 qVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QColorTransform tf;
  QColorSpace fromCS;
  quint16 gray_line [2048];
  undefined1 local_1048 [8];
  QColorSpace local_1040;
  unsigned_short local_1038 [2048];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < length) {
    puVar1 = rasterBuffer->m_buffer;
    lVar3 = (long)x + (long)y * rasterBuffer->bytes_per_line;
    uVar5 = 0;
    do {
      qVar2 = buffer[uVar5].rgba;
      if (((short)qVar2 != (short)(qVar2 >> 0x10)) || ((short)qVar2 != (short)(qVar2 >> 0x20))) {
        local_1040.d_ptr.d.ptr =
             (QExplicitlySharedDataPointer<QColorSpacePrivate>)&DAT_aaaaaaaaaaaaaaaa;
        bVar4 = QColorSpace::isValid(&rasterBuffer->colorSpace);
        if (bVar4) {
          QColorSpace::QColorSpace(&local_1040,&rasterBuffer->colorSpace);
        }
        else {
          QColorSpace::QColorSpace(&local_1040,SRgb);
        }
        local_1048 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        QColorSpacePrivate::transformationToXYZ((QColorSpacePrivate *)local_1048);
        QColorTransformPrivate::apply<unsigned_short,QRgba64>
                  ((QColorTransformPrivate *)local_1048,local_1038,buffer,(ulong)(uint)length,
                   (TransformFlags)0x2);
        uVar5 = 1;
        if (1 < length) {
          uVar5 = (ulong)(uint)length;
        }
        uVar7 = 0;
        do {
          puVar1[uVar7 + lVar3] =
               (uchar)(((uint)local_1038[uVar7] - (local_1038[uVar7] + 0x80 >> 8)) + 0x80 >> 8);
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
        QColorTransform::~QColorTransform((QColorTransform *)local_1048);
        QColorSpace::~QColorSpace(&local_1040);
        break;
      }
      uVar6 = ((uint)qVar2 & 0xffff) + 0x80;
      puVar1[uVar5 + lVar3] = (uchar)(uVar6 - (uVar6 >> 8) >> 8);
      uVar5 = uVar5 + 1;
    } while ((uint)length != uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void QT_FASTCALL destStore64Gray8(QRasterBuffer *rasterBuffer, int x, int y, const QRgba64 *buffer, int length)
{
    uchar *data = rasterBuffer->scanLine(y) + x;

    bool failed = false;
    for (int k = 0; k < length; ++k) {
        if (buffer[k].red() != buffer[k].green() || buffer[k].red() != buffer[k].blue()) {
            failed = true;
            break;
        }
        data[k] = buffer[k].red8();
    }
    if (failed) { // Non-gray colors
        QColorSpace fromCS = rasterBuffer->colorSpace.isValid() ? rasterBuffer->colorSpace : QColorSpace::SRgb;
        QColorTransform tf = QColorSpacePrivate::get(fromCS)->transformationToXYZ();
        QColorTransformPrivate *tfd = QColorTransformPrivate::get(tf);

        Q_DECL_UNINITIALIZED quint16 gray_line[BufferSize];
        tfd->apply(gray_line, buffer, length, QColorTransformPrivate::InputPremultiplied);
        for (int k = 0; k < length; ++k)
            data[k] = qt_div_257(gray_line[k]);
    }
}